

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O2

void __thiscall ipx::Basis::FreeBasicVariable(Basis *this,Int j)

{
  int *piVar1;
  int iVar2;
  BasicStatus BVar3;
  
  iVar2 = this->model_->num_rows_;
  BVar3 = StatusOf(this,j);
  if (BVar3 != BASIC_FREE) {
    piVar1 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + j;
    *piVar1 = *piVar1 + iVar2;
  }
  return;
}

Assistant:

void Basis::FreeBasicVariable(Int j) {
    const Int m = model_.rows();
    if (StatusOf(j) == BASIC_FREE)
        return;
    assert(StatusOf(j) == BASIC);
    assert(map2basis_[j] >= 0 && map2basis_[j] < m);
    map2basis_[j] += m;
}